

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_casts.cpp
# Opt level: O1

unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true> __thiscall
duckdb::BindEnumCast(duckdb *this,BindCastInput *input,LogicalType *source,LogicalType *target)

{
  undefined8 *puVar1;
  BoundCastInfo from_varchar_cast;
  BoundCastInfo to_varchar_cast;
  BoundCastInfo local_80;
  BoundCastInfo local_68;
  LogicalType local_50;
  GetCastFunctionInput local_38;
  
  LogicalType::LogicalType((LogicalType *)&local_80,VARCHAR);
  local_50._0_8_ = (input->context).ptr;
  local_50.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)(input->query_location).index;
  CastFunctionSet::GetCastFunction
            (&local_68,input->function_set,source,(LogicalType *)&local_80,
             (GetCastFunctionInput *)&local_50);
  LogicalType::~LogicalType((LogicalType *)&local_80);
  LogicalType::LogicalType(&local_50,VARCHAR);
  local_38.context.ptr = (input->context).ptr;
  local_38.query_location.index = (input->query_location).index;
  CastFunctionSet::GetCastFunction(&local_80,input->function_set,&local_50,target,&local_38);
  LogicalType::~LogicalType(&local_50);
  puVar1 = (undefined8 *)operator_new(0x38);
  puVar1[1] = local_68.function;
  puVar1[2] = local_68.init_local_state;
  *(undefined4 *)(puVar1 + 4) = local_80.function._0_4_;
  *(undefined4 *)((long)puVar1 + 0x24) = local_80.function._4_4_;
  *(undefined4 *)(puVar1 + 5) = local_80.init_local_state._0_4_;
  *(undefined4 *)((long)puVar1 + 0x2c) = local_80.init_local_state._4_4_;
  *puVar1 = &PTR__EnumBoundCastData_024938f0;
  ((unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_> *)(puVar1 + 3))->
  _M_t = (__uniq_ptr_data<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true,_true>
          )local_68.cast_data.
           super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t
           .
           super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>
           .super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl;
  puVar1[6] = local_80.cast_data.
              super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>.
              _M_t.
              super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>
              .super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl;
  *(undefined8 **)this = puVar1;
  return (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>)
         (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>)this;
}

Assistant:

unique_ptr<BoundCastData> BindEnumCast(BindCastInput &input, const LogicalType &source, const LogicalType &target) {
	auto to_varchar_cast = input.GetCastFunction(source, LogicalType::VARCHAR);
	auto from_varchar_cast = input.GetCastFunction(LogicalType::VARCHAR, target);
	return make_uniq<EnumBoundCastData>(std::move(to_varchar_cast), std::move(from_varchar_cast));
}